

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  double dVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  Mem *pVal;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  sqlite3_int64 sVar8;
  sqlite3_int64 sVar9;
  uchar *zDate;
  long lVar10;
  long lVar11;
  DateTime *pDVar12;
  byte *z;
  uchar *zDate_00;
  long lVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  int M;
  DateTime *local_a8;
  sqlite3_context *local_a0;
  double local_98;
  int Y;
  undefined4 uStack_8c;
  sqlite3_value **local_88;
  int local_7c;
  double local_78;
  long local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = setDateTimeToCurrent(context,p);
    return iVar5;
  }
  pVal = *argv;
  local_a0 = context;
  local_88 = argv;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
      [pVal->flags & 0x1f] - 1 < 2) {
    dVar16 = sqlite3VdbeRealValue(pVal);
  }
  else {
    zDate = sqlite3_value_text(pVal);
    if (zDate == (uchar *)0x0) {
      return 1;
    }
    uVar4 = *zDate;
    uVar14 = (ulong)(uVar4 == '-');
    iVar5 = getDigits((char *)(zDate + uVar14),"40f-21a-21d",&Y,&M,&local_7c);
    if (iVar5 == 3) {
      zDate_00 = zDate + uVar14 + 9;
      do {
        do {
          pbVar7 = zDate_00 + 1;
          zDate_00 = zDate_00 + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar5 = parseHhMmSs((char *)zDate_00,p);
      argv = local_88;
      if (iVar5 != 0) {
        if (*zDate_00 != '\0') goto LAB_0019af57;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -Y;
      if (uVar4 != '-') {
        iVar5 = Y;
      }
      p->Y = iVar5;
      p->M = M;
      p->D = local_7c;
      if (p->validTZ != '\0') {
        computeJD(p);
        argv = local_88;
      }
      goto LAB_0019a84b;
    }
LAB_0019af57:
    iVar5 = parseHhMmSs((char *)zDate,p);
    if (iVar5 == 0) goto LAB_0019a84b;
    iVar5 = sqlite3StrICmp((char *)zDate,"now");
    if ((iVar5 == 0) && (iVar5 = sqlite3NotPureFunc(local_a0), iVar5 != 0)) {
      iVar5 = setDateTimeToCurrent(local_a0,p);
      if (iVar5 != 0) {
        return 1;
      }
      goto LAB_0019a84b;
    }
    iVar5 = sqlite3Strlen30((char *)zDate);
    iVar5 = sqlite3AtoF((char *)zDate,(double *)&local_68,iVar5,'\x01');
    dVar16 = (double)local_68.iJD;
    if (iVar5 == 0) {
      return 1;
    }
  }
  setRawDateNumber(p,dVar16);
LAB_0019a84b:
  local_70 = (long)argc;
  lVar13 = 1;
  local_a8 = p;
  do {
    pDVar12 = local_a8;
    if (local_70 <= lVar13) {
      computeJD(local_a8);
      uVar6 = 1;
      if (pDVar12->isError == '\0') {
        uVar6 = (uint)(0x1a6401072fdff < (ulong)pDVar12->iJD);
      }
      return uVar6;
    }
    pbVar7 = sqlite3_value_text(argv[lVar13]);
    sqlite3_value_bytes(argv[lVar13]);
    if (pbVar7 == (byte *)0x0) {
      return 1;
    }
    M = 1;
    bVar2 = *pbVar7;
    bVar3 = ""[bVar2];
    if ((bVar3 - 0x30 < 10) || (bVar3 == 0x2b)) {
LAB_0019a8b1:
      lVar10 = 1;
      z = pbVar7;
      while( true ) {
        bVar3 = pbVar7[lVar10];
        if (((bVar3 == 0) || (bVar3 == 0x3a)) || ((""[bVar3] & 1) != 0)) break;
        lVar10 = lVar10 + 1;
        z = z + 1;
      }
      iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&Y,(int)lVar10,'\x01');
      if (iVar5 == 0) {
        return 1;
      }
      if (bVar3 == 0x3a) {
        local_68.s = 0.0;
        local_68.validJD = '\0';
        local_68.rawS = '\0';
        local_68.validYMD = '\0';
        local_68.validHMS = '\0';
        local_68.validTZ = '\0';
        local_68.tzSet = '\0';
        local_68.isError = '\0';
        local_68._47_1_ = 0;
        local_68.D = 0;
        local_68.h = 0;
        local_68.m = 0;
        local_68.tz = 0;
        local_68.iJD = 0;
        local_68.Y = 0;
        local_68.M = 0;
        iVar5 = parseHhMmSs((char *)(pbVar7 + ((ulong)bVar2 - 0x3a < 0xfffffffffffffff6)),&local_68)
        ;
        if (iVar5 == 0) {
          computeJD(&local_68);
          pDVar12 = local_a8;
          lVar11 = (local_68.iJD + -43200000) % 86400000;
          lVar10 = -lVar11;
          if (*pbVar7 != 0x2d) {
            lVar10 = lVar11;
          }
          computeJD(local_a8);
          pDVar12->validYMD = '\0';
          pDVar12->validHMS = '\0';
          pDVar12->validTZ = '\0';
          pDVar12->iJD = pDVar12->iJD + lVar10;
          M = 0;
        }
      }
      else {
        do {
          pbVar7 = z + 1;
          z = z + 1;
        } while ((""[*pbVar7] & 1) != 0);
        uVar6 = sqlite3Strlen30((char *)z);
        if (0xfffffff7 < uVar6 - 0xb) {
          if ((z[uVar6 - 1] & 0xdf) == 0x53) {
            uVar6 = uVar6 - 1;
          }
          computeJD(local_a8);
          M = 1;
          local_98 = (double)CONCAT44(uStack_8c,Y);
          local_78 = *(double *)(&DAT_001ea4a0 + (ulong)(local_98 < 0.0) * 8);
          for (lVar10 = 0; lVar10 != 0xc0; lVar10 = lVar10 + 0x20) {
            if (((uVar6 == (&aXformType[0].nName)[lVar10]) &&
                (iVar5 = sqlite3_strnicmp(*(char **)((long)&aXformType[0].zName + lVar10),(char *)z,
                                          uVar6), dVar16 = local_98, pDVar12 = local_a8, iVar5 == 0)
                ) && ((dVar1 = *(double *)((long)&aXformType[0].rLimit + lVar10), -dVar1 < local_98
                      && (local_98 < dVar1)))) {
              if ((&aXformType[0].eType)[lVar10] == '\x02') {
                iVar5 = (int)local_98;
                computeYMD_HMS(local_a8);
                pDVar12->Y = pDVar12->Y + iVar5;
LAB_0019ae40:
                pDVar12->validJD = '\0';
                local_98 = local_98 - (double)(int)dVar16;
              }
              else if ((&aXformType[0].eType)[lVar10] == '\x01') {
                iVar15 = (int)local_98;
                computeYMD_HMS(local_a8);
                iVar5 = pDVar12->M + iVar15;
                if (iVar5 == 0 || SCARRY4(pDVar12->M,iVar15) != iVar5 < 0) {
                  uVar6 = -((0xcU - iVar5) / 0xc);
                }
                else {
                  uVar6 = (iVar5 - 1U) / 0xc;
                }
                local_a8->Y = local_a8->Y + uVar6;
                local_a8->M = uVar6 * -0xc + iVar5;
                pDVar12 = local_a8;
                goto LAB_0019ae40;
              }
              computeJD(pDVar12);
              pDVar12->iJD = pDVar12->iJD +
                             (long)(local_98 * *(double *)((long)&aXformType[0].rXform + lVar10) +
                                   local_78);
              M = 0;
              break;
            }
          }
          local_a8->validYMD = '\0';
          local_a8->validHMS = '\0';
          local_a8->validTZ = '\0';
        }
      }
LAB_0019ae92:
      if (M != 0) {
        return 1;
      }
    }
    else {
      if (bVar3 == 0x77) {
        iVar5 = sqlite3_strnicmp((char *)pbVar7,"weekday ",8);
        if (iVar5 == 0) {
          iVar5 = sqlite3Strlen30((char *)(pbVar7 + 8));
          iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&Y,iVar5,'\x01');
          pDVar12 = local_a8;
          if (((iVar5 != 0) && (dVar16 = (double)CONCAT44(uStack_8c,Y), dVar16 < 7.0)) &&
             (uVar6 = (uint)dVar16, -1 < (int)uVar6)) {
            if ((dVar16 == (double)(int)dVar16) && (!NAN(dVar16) && !NAN((double)(int)dVar16))) {
              computeYMD_HMS(local_a8);
              pDVar12->validTZ = '\0';
              pDVar12->validJD = '\0';
              computeJD(pDVar12);
              lVar10 = ((pDVar12->iJD + 0x7b98a00) / 86400000) % 7;
              if ((long)(ulong)uVar6 < lVar10) {
                lVar10 = lVar10 + -7;
              }
              pDVar12->iJD = ((ulong)uVar6 - lVar10) * 86400000 + pDVar12->iJD;
              pDVar12->validYMD = '\0';
              pDVar12->validHMS = '\0';
              pDVar12->validTZ = '\0';
              goto LAB_0019ae99;
            }
          }
        }
        goto LAB_0019ae92;
      }
      if (bVar3 == 0x6c) {
        iVar5 = sqlite3StrICmp((char *)pbVar7,"localtime");
        if ((iVar5 == 0) && (iVar5 = sqlite3NotPureFunc(local_a0), pDVar12 = local_a8, iVar5 != 0))
        {
          computeJD(local_a8);
          sVar8 = localtimeOffset(pDVar12,local_a0,&M);
          pDVar12->iJD = pDVar12->iJD + sVar8;
          pDVar12->validYMD = '\0';
          pDVar12->validHMS = '\0';
          pDVar12->validTZ = '\0';
        }
        goto LAB_0019ae92;
      }
      if (bVar3 == 0x73) {
        iVar5 = sqlite3_strnicmp((char *)pbVar7,"start of ",9);
        pDVar12 = local_a8;
        if ((iVar5 == 0) &&
           (((local_a8->validJD != '\0' || (local_a8->validYMD != '\0')) ||
            (local_a8->validHMS != '\0')))) {
          pbVar7 = pbVar7 + 9;
          computeYMD(local_a8);
          pDVar12->validHMS = '\x01';
          pDVar12->validTZ = '\0';
          pDVar12->h = 0;
          pDVar12->m = 0;
          pDVar12->s = 0.0;
          pDVar12->validJD = '\0';
          pDVar12->rawS = '\0';
          iVar5 = sqlite3StrICmp((char *)pbVar7,"month");
          if (iVar5 == 0) {
            pDVar12->D = 1;
          }
          else {
            iVar5 = sqlite3StrICmp((char *)pbVar7,"year");
            if (iVar5 == 0) {
              local_a8->M = 1;
              local_a8->D = 1;
            }
            else {
              iVar5 = sqlite3StrICmp((char *)pbVar7,"day");
              if (iVar5 != 0) goto LAB_0019ae92;
            }
          }
          goto LAB_0019ae99;
        }
        goto LAB_0019ae92;
      }
      if (bVar3 != 0x75) {
        if (bVar3 == 0x2d) goto LAB_0019a8b1;
        goto LAB_0019ae92;
      }
      iVar5 = sqlite3StrICmp((char *)pbVar7,"unixepoch");
      if ((iVar5 != 0) || (local_a8->rawS == '\0')) {
        iVar5 = sqlite3StrICmp((char *)pbVar7,"utc");
        if ((iVar5 == 0) && (iVar5 = sqlite3NotPureFunc(local_a0), pDVar12 = local_a8, iVar5 != 0))
        {
          if (local_a8->tzSet != '\0') goto LAB_0019ae99;
          computeJD(local_a8);
          sVar8 = localtimeOffset(pDVar12,local_a0,&M);
          if (M == 0) {
            pDVar12->iJD = pDVar12->iJD - sVar8;
            pDVar12->validYMD = '\0';
            pDVar12->validHMS = '\0';
            pDVar12->validTZ = '\0';
            sVar9 = localtimeOffset(pDVar12,local_a0,&M);
            pDVar12->iJD = pDVar12->iJD + (sVar8 - sVar9);
          }
          pDVar12->tzSet = '\x01';
        }
        goto LAB_0019ae92;
      }
      dVar16 = local_a8->s * 1000.0 + 210866760000000.0;
      if ((dVar16 < 0.0) || (464269060800000.0 <= dVar16)) goto LAB_0019ae92;
      local_a8->validTZ = '\0';
      local_a8->iJD = (long)dVar16;
      local_a8->validJD = '\x01';
      local_a8->rawS = '\0';
      local_a8->validYMD = '\0';
      local_a8->validHMS = '\0';
    }
LAB_0019ae99:
    lVar13 = lVar13 + 1;
    argv = local_88;
  } while( true );
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}